

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::ComputeShaderTest::CheckProgram
          (ComputeShaderTest *this,GLuint program,bool *compile_error)

{
  void *pvVar1;
  long lVar2;
  char *format;
  int iVar3;
  CallLogWrapper *this_00;
  bool bVar4;
  GLint length_1;
  GLint attached_shaders;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  GLenum type;
  GLint length;
  GLint res;
  GLint status;
  int local_84;
  int local_80;
  allocator_type local_79;
  vector<char,_std::allocator<char>_> local_78;
  int local_5c;
  vector<char,_std::allocator<char>_> local_58;
  GLuint local_3c;
  int local_38;
  int local_34;
  
  this_00 = &(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_34);
  if (local_34 == 0) {
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b85,&local_80);
    if ((long)local_80 < 1) {
      bVar4 = true;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,(long)local_80,
                 (allocator_type *)&local_58);
      glu::CallLogWrapper::glGetAttachedShaders
                (this_00,program,local_80,(GLsizei *)0x0,
                 (GLuint *)
                 local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (local_80 < 1) {
        bVar4 = true;
      }
      else {
        iVar3 = 1;
        lVar2 = 0;
        local_3c = program;
        do {
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_78.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b4f,
                     &local_5c);
          if (local_5c < 0x8e87) {
            if (local_5c == 0x8b30) {
              format = "*** Fragment Shader ***\n";
            }
            else {
              format = "*** Vertex Shader ***\n";
              if (local_5c != 0x8b31) {
                if (local_5c == 0x8dd9) {
                  format = "*** Geometry Shader ***\n";
                }
                else {
LAB_00c27c13:
                  format = "*** Unknown Shader ***\n";
                }
              }
            }
          }
          else if (local_5c == 0x8e87) {
            format = "*** Tessellation Evaluation Shader ***\n";
          }
          else if (local_5c == 0x8e88) {
            format = "*** Tessellation Control Shader ***\n";
          }
          else {
            if (local_5c != 0x91b9) goto LAB_00c27c13;
            format = "*** Compute Shader ***\n";
          }
          anon_unknown_0::Output(format);
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_78.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b81,
                     &local_38);
          if (local_38 != 1) {
            iVar3 = local_38;
          }
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_78.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b88,
                     &local_84);
          if (0 < (long)local_84) {
            std::vector<char,_std::allocator<char>_>::vector(&local_58,(long)local_84,&local_79);
            glu::CallLogWrapper::glGetShaderSource
                      (this_00,*(GLuint *)
                                ((long)local_78.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),
                       local_84,(GLsizei *)0x0,
                       (GLchar *)
                       CONCAT44(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_58.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
            anon_unknown_0::Output
                      ("%s\n",CONCAT44(local_58.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_58.super__Vector_base<char,_std::allocator<char>_>
                                            ._M_impl.super__Vector_impl_data._M_start));
            pvVar1 = (void *)CONCAT44(local_58.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)local_58.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_start);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_58.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar1);
            }
          }
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_78.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b84,
                     &local_84);
          if (0 < (long)local_84) {
            std::vector<char,_std::allocator<char>_>::vector(&local_58,(long)local_84,&local_79);
            glu::CallLogWrapper::glGetShaderInfoLog
                      (this_00,*(GLuint *)
                                ((long)local_78.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),
                       local_84,(GLsizei *)0x0,
                       (GLchar *)
                       CONCAT44(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_58.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
            anon_unknown_0::Output
                      ("%s\n",CONCAT44(local_58.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_58.super__Vector_base<char,_std::allocator<char>_>
                                            ._M_impl.super__Vector_impl_data._M_start));
            pvVar1 = (void *)CONCAT44(local_58.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)local_58.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_start);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_58.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar1);
            }
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < local_80);
        bVar4 = iVar3 == 1;
        program = local_3c;
      }
      if ((GLuint *)
          local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (GLuint *)0x0) {
        operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,(GLint *)&local_58);
    if (0 < (long)(int)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) {
      std::vector<char,_std::allocator<char>_>::vector
                (&local_78,
                 (long)(int)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,(allocator_type *)&local_5c);
      glu::CallLogWrapper::glGetProgramInfoLog
                (this_00,program,
                 (int)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(GLsizei *)0x0,
                 local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      anon_unknown_0::Output
                ("%s\n",local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      if ((GLuint *)
          local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (GLuint *)0x0) {
        operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (!bVar4) {
      return false;
    }
  }
  return local_34 == 1;
}

Assistant:

bool CheckProgram(GLuint program, bool* compile_error = NULL)
	{
		GLint compile_status = GL_TRUE;
		GLint status;
		glGetProgramiv(program, GL_LINK_STATUS, &status);

		if (status == GL_FALSE)
		{
			GLint attached_shaders;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						Output("*** Vertex Shader ***\n");
						break;
					case GL_TESS_CONTROL_SHADER:
						Output("*** Tessellation Control Shader ***\n");
						break;
					case GL_TESS_EVALUATION_SHADER:
						Output("*** Tessellation Evaluation Shader ***\n");
						break;
					case GL_GEOMETRY_SHADER:
						Output("*** Geometry Shader ***\n");
						break;
					case GL_FRAGMENT_SHADER:
						Output("*** Fragment Shader ***\n");
						break;
					case GL_COMPUTE_SHADER:
						Output("*** Compute Shader ***\n");
						break;
					default:
						Output("*** Unknown Shader ***\n");
						break;
					}

					GLint res;
					glGetShaderiv(shaders[i], GL_COMPILE_STATUS, &res);
					if (res != GL_TRUE)
						compile_status = res;

					// shader source
					GLint length;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						Output("%s\n", &source[0]);
					}

					// shader info log
					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						Output("%s\n", &log[0]);
					}
				}
			}

			// program info log
			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				Output("%s\n", &log[0]);
			}
		}

		if (compile_error)
			*compile_error = (compile_status == GL_TRUE ? false : true);
		if (compile_status != GL_TRUE)
			return false;
		return status == GL_TRUE ? true : false;
	}